

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

ValueHolder *
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (ThreadLocalValueHolderBase *base)

{
  char *__s1;
  int iVar1;
  ValueHolder *pVVar2;
  undefined8 uVar3;
  GTestLog local_c;
  
  if (base == (ThreadLocalValueHolderBase *)0x0) {
    uVar3 = __cxa_bad_typeid();
    GTestLog::~GTestLog(&local_c);
    _Unwind_Resume(uVar3);
  }
  __s1 = *(char **)(base->_vptr_ThreadLocalValueHolderBase[-1] + 8);
  if (__s1 != 
      "N7testing8internal11ThreadLocalIPNS_31TestPartResultReporterInterfaceEE11ValueHolderE") {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,
                     "N7testing8internal11ThreadLocalIPNS_31TestPartResultReporterInterfaceEE11ValueHolderE"
                    );
      if (iVar1 == 0) goto LAB_001342cb;
    }
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x45a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
    GTestLog::~GTestLog(&local_c);
  }
LAB_001342cb:
  pVVar2 = (ValueHolder *)
           __dynamic_cast(base,&ThreadLocalValueHolderBase::typeinfo,
                          &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                           typeinfo,0);
  return pVVar2;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}